

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O2

void __thiscall
slang::ast::ReplicatedAssignmentPatternExpression::visitExprs<register_has_no_reset::MainVisitor&>
          (ReplicatedAssignmentPatternExpression *this,AlwaysFFVisitor *visitor)

{
  Expression::visit<register_has_no_reset::MainVisitor&>(this->count_,visitor);
  AssignmentPatternExpressionBase::visitExprs<register_has_no_reset::MainVisitor&>
            (&this->super_AssignmentPatternExpressionBase,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        count().visit(visitor);
        AssignmentPatternExpressionBase::visitExprs(visitor);
    }